

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
* __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
parse_host_port(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
                *__return_storage_ptr__,
               ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
               *this,string *host_port,unsigned_short default_port)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  unsigned_long uVar5;
  int iVar6;
  size_type sVar7;
  string host;
  string port;
  
  host._M_dataplus._M_p = (pointer)&host.field_2;
  host._M_string_length = 0;
  port._M_dataplus._M_p = (pointer)&port.field_2;
  port._M_string_length = 0;
  iVar6 = 0;
  host.field_2._M_local_buf[0] = '\0';
  port.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&host);
  pcVar2 = (host_port->_M_dataplus)._M_p;
  sVar3 = host_port->_M_string_length;
  bVar4 = false;
  for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
    cVar1 = pcVar2[sVar7];
    if (cVar1 == ']') {
      iVar6 = iVar6 + -1;
    }
    else if (cVar1 == '[') {
      iVar6 = iVar6 + 1;
    }
    else if (iVar6 == 0 && cVar1 == ':') {
      iVar6 = 0;
      bVar4 = true;
    }
    else if (bVar4) {
      std::__cxx11::string::push_back((char)&port);
      bVar4 = true;
    }
    else {
      std::__cxx11::string::push_back((char)&host);
      bVar4 = false;
    }
  }
  if (port._M_string_length == 0) {
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)host._M_dataplus._M_p == &host.field_2) goto LAB_00178ff8;
  }
  else {
    uVar5 = std::__cxx11::stoul(&port,(size_t *)0x0,10);
    default_port = (unsigned_short)uVar5;
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)host._M_dataplus._M_p == &host.field_2) {
LAB_00178ff8:
      (__return_storage_ptr__->first).field_2._M_allocated_capacity =
           CONCAT71(host.field_2._M_allocated_capacity._1_7_,host.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = host.field_2._8_8_;
      goto LAB_00178fff;
    }
  }
  (__return_storage_ptr__->first)._M_dataplus._M_p = host._M_dataplus._M_p;
  (__return_storage_ptr__->first).field_2._M_allocated_capacity =
       CONCAT71(host.field_2._M_allocated_capacity._1_7_,host.field_2._M_local_buf[0]);
LAB_00178fff:
  sVar3 = host._M_string_length;
  host._M_dataplus._M_p = (pointer)&host.field_2;
  host._M_string_length = 0;
  (__return_storage_ptr__->first)._M_string_length = sVar3;
  host.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->second = default_port;
  std::__cxx11::string::~string((string *)&port);
  std::__cxx11::string::~string((string *)&host);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, unsigned short> parse_host_port(const std::string &host_port, unsigned short default_port) const noexcept {
      std::string host, port;
      host.reserve(host_port.size());
      bool parse_port = false;
      int square_count = 0; // To parse IPv6 addresses
      for(auto chr : host_port) {
        if(chr == '[')
          ++square_count;
        else if(chr == ']')
          --square_count;
        else if(square_count == 0 && chr == ':')
          parse_port = true;
        else if(!parse_port)
          host += chr;
        else
          port += chr;
      }

      if(port.empty())
        return {std::move(host), default_port};
      else {
        try {
          return {std::move(host), static_cast<unsigned short>(std::stoul(port))};
        }
        catch(...) {
          return {std::move(host), default_port};
        }
      }
    }